

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O0

void predict_or_learn<true,&expf>(scorer *s,single_learner *base,example *ec)

{
  long *plVar1;
  long in_RDX;
  size_t in_RSI;
  example *in_RDI;
  float fVar2;
  
  (**(code **)((in_RDI->super_example_predict).indices._begin + 0x40))
            (*(undefined4 *)(in_RDX + 0x6828),
             *(undefined8 *)(in_RDI->super_example_predict).indices._begin);
  if (((*(float *)(in_RDX + 0x6828) == 3.4028235e+38) && (!NAN(*(float *)(in_RDX + 0x6828)))) ||
     (*(float *)(in_RDX + 0x6870) <= 0.0)) {
    LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,in_RSI);
  }
  else {
    LEARNER::learner<char,_example>::learn((learner<char,_example> *)ec,in_RDI,in_RSI);
  }
  if ((0.0 < *(float *)(in_RDX + 0x6870)) &&
     ((*(float *)(in_RDX + 0x6828) != 3.4028235e+38 || (NAN(*(float *)(in_RDX + 0x6828)))))) {
    plVar1 = *(long **)((in_RDI->super_example_predict).indices._begin + 0x3548);
    fVar2 = (float)(**(code **)(*plVar1 + 8))
                             (*(undefined4 *)(in_RDX + 0x6850),*(undefined4 *)(in_RDX + 0x6828),
                              plVar1,*(undefined8 *)(in_RDI->super_example_predict).indices._begin);
    *(float *)(in_RDX + 0x68b0) = fVar2 * *(float *)(in_RDX + 0x6870);
  }
  fVar2 = expf(*(float *)(in_RDX + 0x6850));
  *(float *)(in_RDX + 0x6850) = fVar2;
  return;
}

Assistant:

void predict_or_learn(scorer& s, LEARNER::single_learner& base, example& ec)
{
  s.all->set_minmax(s.all->sd, ec.l.simple.label);
  if (is_learn && ec.l.simple.label != FLT_MAX && ec.weight > 0)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.weight > 0 && ec.l.simple.label != FLT_MAX)
    ec.loss = s.all->loss->getLoss(s.all->sd, ec.pred.scalar, ec.l.simple.label) * ec.weight;

  ec.pred.scalar = link(ec.pred.scalar);
}